

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O1

void processWarningFlag(char *flag)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  char *pcVar5;
  WarningState state;
  WarningState state_00;
  char **ppcVar6;
  byte bVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  
  iVar3 = strcmp(flag,"all");
  lVar9 = 0;
  if (iVar3 == 0) {
    bVar11 = false;
  }
  else {
    do {
      bVar11 = lVar9 == 2;
      if (bVar11) goto LAB_001153d6;
      iVar3 = strcmp(flag,warningFlags[lVar9 + 0x17]);
      lVar9 = lVar9 + 1;
    } while (iVar3 != 0);
  }
  if (processWarningFlag(char*)::setError == '\x01') {
    errx("Cannot make meta warning \"%s\" into an error",flag);
  }
  pbVar4 = metaWarningCommands[lVar9];
  bVar7 = *pbVar4;
  while (bVar7 != 0x19) {
    pbVar4 = pbVar4 + 1;
    if (warningStates[bVar7] == WARNING_DEFAULT) {
      warningStates[bVar7] = WARNING_ENABLED;
    }
    bVar7 = *pbVar4;
  }
  if (!bVar11) {
    return;
  }
LAB_001153d6:
  iVar3 = strncmp(flag,"error",5);
  if (iVar3 == 0) {
    if (flag[5] == '=') {
      processWarningFlag(char*)::setError = 1;
      processWarningFlag(flag + 6);
      processWarningFlag(char*)::setError = 0;
      return;
    }
    if (flag[5] == '\0') {
      warningsAreErrors = true;
      return;
    }
  }
  state_00 = WARNING_ERROR;
  if (processWarningFlag(char*)::setError == '\0') {
    iVar3 = strncmp(flag,"no-",3);
    state_00 = WARNING_ENABLED - (iVar3 == 0);
  }
  pcVar8 = flag + (ulong)(state_00 == WARNING_DISABLED) * 3;
  if (((state_00 != WARNING_DISABLED) && (pcVar5 = strchr(pcVar8,0x3d), pcVar5 != (char *)0x0)) &&
     (pcVar5[1] != '\0')) {
    pcVar10 = pcVar5 + 1;
    bVar7 = 0;
    bVar11 = false;
    do {
      cVar1 = *pcVar10;
      if ((byte)(cVar1 - 0x3aU) < 0xf6) break;
      if ((byte)(0x2fU - cVar1) < bVar7) {
        bVar7 = 0xff;
        bVar2 = !bVar11;
        bVar11 = true;
        if (bVar2) {
          warnx("Invalid warning flag \"%s\": capping parameter at 255\n",flag);
        }
      }
      else {
        bVar7 = (bVar7 * '\n' + cVar1) - 0x30;
        pcVar10 = pcVar10 + 1;
      }
    } while (*pcVar10 != '\0');
    if (*pcVar10 == '\0') {
      if ((processWarningFlag(char*)::setError == '\x01') && (bVar7 == 0)) {
        pcVar8 = "Ignoring nonsensical warning flag \"%s\"\n";
        goto LAB_001154fc;
      }
      *pcVar5 = '\0';
      state = WARNING_DISABLED;
      if (bVar7 != 0) {
        state = state_00;
      }
      bVar11 = tryProcessParamWarning(pcVar8,bVar7,state);
      if (bVar11) {
        return;
      }
    }
  }
  ppcVar6 = warningFlags;
  lVar9 = 0;
  do {
    iVar3 = strcmp(pcVar8,*ppcVar6);
    if (iVar3 == 0) {
      *(WarningState *)((long)warningStates + lVar9) = state_00;
      return;
    }
    lVar9 = lVar9 + 4;
    ppcVar6 = ppcVar6 + 1;
  } while (lVar9 != 0x40);
  bVar11 = tryProcessParamWarning(pcVar8,'\0',state_00);
  if (bVar11) {
    return;
  }
  pcVar8 = "Unknown warning `%s`";
LAB_001154fc:
  warnx(pcVar8,flag);
  return;
}

Assistant:

void processWarningFlag(char *flag)
{
	static bool setError = false;

	// First, try to match against a "meta" warning
	for (enum WarningID id : EnumSeq(META_WARNINGS_START, NB_WARNINGS)) {
		// TODO: improve the matching performance?
		if (!strcmp(flag, warningFlags[id])) {
			// We got a match!
			if (setError)
				errx("Cannot make meta warning \"%s\" into an error",
				     flag);

			for (uint8_t const *ptr = metaWarningCommands[id - META_WARNINGS_START];
			     *ptr != META_WARNING_DONE; ptr++) {
				// Warning flag, set without override
				if (warningStates[*ptr] == WARNING_DEFAULT)
					warningStates[*ptr] = WARNING_ENABLED;
			}

			return;
		}
	}

	// If it's not a meta warning, specially check against `-Werror`
	if (!strncmp(flag, "error", strlen("error"))) {
		char *errorFlag = flag + strlen("error");

		switch (*errorFlag) {
		case '\0':
			// `-Werror`
			warningsAreErrors = true;
			return;

		case '=':
			// `-Werror=XXX`
			setError = true;
			processWarningFlag(errorFlag + 1); // Skip the `=`
			setError = false;
			return;

		// Otherwise, allow parsing as another flag
		}
	}

	// Well, it's either a normal warning or a mistake

	enum WarningState state = setError ? WARNING_ERROR :
				  // Not an error, then check if this is a negation
				  strncmp(flag, "no-", strlen("no-")) ? WARNING_ENABLED
								      : WARNING_DISABLED;
	char *rootFlag = state == WARNING_DISABLED ? flag + strlen("no-") : flag;

	// Is this a "parametric" warning?
	if (state != WARNING_DISABLED) { // The `no-` form cannot be parametrized
		// First, check if there is an "equals" sign followed by a decimal number
		char *equals = strchr(rootFlag, '=');

		if (equals && equals[1] != '\0') { // Ignore an equal sign at the very end as well
			// Is the rest of the string a decimal number?
			// We want to avoid `strtoul`'s whitespace and sign, so we parse manually
			uint8_t param = 0;
			char const *ptr = equals + 1;
			bool warned = false;

			// The `if`'s condition above ensures that this will run at least once
			do {
				// If we don't have a digit, bail
				if (*ptr < '0' || *ptr > '9')
					break;
				// Avoid overflowing!
				if (param > UINT8_MAX - (*ptr - '0')) {
					if (!warned)
						warnx("Invalid warning flag \"%s\": capping parameter at 255\n",
						      flag);
					warned = true; // Only warn once, cap always
					param = 255;
					continue;
				}
				param = param * 10 + (*ptr - '0');

				ptr++;
			} while (*ptr);

			// If we managed to the end of the string, check that the warning indeed
			// accepts a parameter
			if (*ptr == '\0') {
				if (setError && param == 0) {
					warnx("Ignoring nonsensical warning flag \"%s\"\n", flag);
					return;
				}
				*equals = '\0'; // Truncate the param at the '='
				if (tryProcessParamWarning(rootFlag, param,
							   param == 0 ? WARNING_DISABLED : state))
					return;
			}
		}
	}

	// Try to match the flag against a "normal" flag
	for (enum WarningID id : EnumSeq(NB_PLAIN_WARNINGS)) {
		if (!strcmp(rootFlag, warningFlags[id])) {
			// We got a match!
			warningStates[id] = state;
			return;
		}
	}

	// Lastly, this might be a "parametric" warning without an equals sign
	// If it is, treat the param as 1 if enabling, or 0 if disabling
	if (tryProcessParamWarning(rootFlag, 0, state))
		return;

	warnx("Unknown warning `%s`", flag);
}